

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O3

reentrant_consume_operation * __thiscall
density::
conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
::try_start_reentrant_consume
          (reentrant_consume_operation *__return_storage_ptr__,
          conc_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>_>
          *this)

{
  ulong uVar1;
  int iVar2;
  ControlBlock *pCVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  pCVar3 = (this->m_queue).m_head;
  do {
    if (pCVar3 == (this->m_queue).m_tail) {
      pCVar3 = (ControlBlock *)0x0;
LAB_00a8c545:
      __return_storage_ptr__->m_queue = this;
      (__return_storage_ptr__->m_consume_operation).m_queue = &this->m_queue;
      (__return_storage_ptr__->m_consume_operation).m_control = pCVar3;
      pthread_mutex_unlock((pthread_mutex_t *)this);
      return __return_storage_ptr__;
    }
    uVar1 = pCVar3->m_next;
    if ((uVar1 & 3) == 0) {
      pCVar3->m_next = uVar1 | 1;
      goto LAB_00a8c545;
    }
    pCVar3 = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
  } while( true );
}

Assistant:

reentrant_consume_operation try_start_reentrant_consume() noexcept
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            return reentrant_consume_operation(
              PrivateType(), this, m_queue.try_start_reentrant_consume());
        }